

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O2

void __thiscall
ON_NurbsCurve::ManageKnotForExperts(ON_NurbsCurve *this,int knot_capacity,double *knot)

{
  uint uVar1;
  
  uVar1 = 0;
  if (0 < knot_capacity) {
    uVar1 = knot_capacity & 0xfffffff;
  }
  this->m_knot_capacity_and_tags = uVar1 | this->m_knot_capacity_and_tags & 0xf0000000;
  this->m_knot = knot;
  return;
}

Assistant:

void ON_NurbsCurve::ManageKnotForExperts(
  int knot_capacity,
  double* knot
)
{
  // Unconditionally set m_knot and KnotCapacity().
  // (Do not free preexisting m_knot.)
  const unsigned int tags = (m_knot_capacity_and_tags & ON_NurbsCurve::masks::all_tags);
  const unsigned int new_knot_capacity = (knot_capacity > 0) ? (((unsigned int)knot_capacity) & ON_NurbsCurve::masks::knot_capacity) : 0U;
  m_knot_capacity_and_tags = (tags | new_knot_capacity);
  m_knot = knot;
}